

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void * __thiscall vector<int>::realloc(vector<int> *this,void *__ptr,size_t __size)

{
  int *piVar1;
  void *in_RAX;
  int *__s;
  void *pvVar2;
  void *extraout_RAX;
  void *pvVar3;
  uint uVar4;
  
  uVar4 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar4 = (uint)__ptr;
  }
  if (this->_capacity == uVar4) {
    return in_RAX;
  }
  __s = (int *)operator_new__((ulong)uVar4 << 2);
  memset(__s,0,(ulong)uVar4 << 2);
  pvVar2 = (void *)(long)this->_size;
  piVar1 = this->vect;
  if ((long)pvVar2 < 1) {
    this->_capacity = uVar4;
    if (piVar1 == (int *)0x0) goto LAB_00102ed0;
  }
  else {
    pvVar3 = (void *)0x0;
    do {
      __s[(long)pvVar3] = piVar1[(long)pvVar3];
      pvVar3 = (void *)((long)pvVar3 + 1);
    } while (pvVar2 != pvVar3);
    this->_capacity = uVar4;
  }
  operator_delete__(piVar1);
  pvVar2 = extraout_RAX;
LAB_00102ed0:
  this->vect = __s;
  return pvVar2;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}